

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O0

undefined8 duckdb_apache::thrift::to_string<long>(vector<long,_true> *t)

{
  ostream *poVar1;
  undefined8 in_RDI;
  ostringstream o;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffe08;
  string local_1b8 [48];
  ostringstream local_188 [328];
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
  *in_stack_ffffffffffffffc8;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"[");
  std::vector<long,_std::allocator<long>_>::begin(in_stack_fffffffffffffe08);
  std::vector<long,_std::allocator<long>_>::end(in_stack_fffffffffffffe08);
  to_string<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  poVar1 = std::operator<<(poVar1,local_1b8);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string to_string(const duckdb::vector<T>& t) {
  std::ostringstream o;
  o << "[" << to_string(t.begin(), t.end()) << "]";
  return o.str();
}